

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

void lex_newline(LexState *ls)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = ls->c;
  pbVar2 = (byte *)ls->p;
  if (pbVar2 < ls->pe) {
    ls->p = (char *)(pbVar2 + 1);
    uVar3 = (uint)*pbVar2;
  }
  else {
    uVar3 = lex_more(ls);
  }
  ls->c = uVar3;
  if (((uVar3 == 0xd) || (uVar3 == 10)) && (uVar3 != uVar4)) {
    pbVar2 = (byte *)ls->p;
    if (pbVar2 < ls->pe) {
      ls->p = (char *)(pbVar2 + 1);
      uVar4 = (uint)*pbVar2;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
  }
  iVar1 = ls->linenumber;
  ls->linenumber = iVar1 + 1;
  if (iVar1 < 0x7ffffeff) {
    return;
  }
  lj_lex_error(ls,ls->tok,LJ_ERR_XLINES);
}

Assistant:

static void lex_newline(LexState *ls)
{
  LexChar old = ls->c;
  lj_assertLS(lex_iseol(ls), "bad usage");
  lex_next(ls);  /* Skip "\n" or "\r". */
  if (lex_iseol(ls) && ls->c != old) lex_next(ls);  /* Skip "\n\r" or "\r\n". */
  if (++ls->linenumber >= LJ_MAX_LINE)
    lj_lex_error(ls, ls->tok, LJ_ERR_XLINES);
}